

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O2

int sjtu::timeType::dateminus(timeType *lhs,timeType *rhs)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int i_1;
  
  iVar1 = 0;
  for (lVar3 = 1; lVar3 < lhs->month; lVar3 = lVar3 + 1) {
    iVar1 = iVar1 + *(int *)(months + lVar3 * 4);
  }
  iVar2 = 0;
  for (lVar3 = 1; lVar3 < rhs->month; lVar3 = lVar3 + 1) {
    iVar2 = iVar2 + *(int *)(months + lVar3 * 4);
  }
  return (lhs->day + iVar1) - (iVar2 + rhs->day);
}

Assistant:

int timeType::dateminus(const timeType &lhs, const timeType &rhs) {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i < lhs.month; ++i)
                tmp1 += lhs.months[i];
            tmp1 += lhs.day;
            for (int i = 1; i < rhs.month; ++i)
                tmp2 += rhs.months[i];
            tmp2 += rhs.day;
            return (tmp1 - tmp2);
        }